

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable.hxx
# Opt level: O2

void __thiscall
cmsys::
hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
::~hashtable(hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
             *this)

{
  clear(this);
  std::
  _Vector_base<cmsys::_Hashtable_node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::allocator<cmsys::_Hashtable_node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>_>
  ::~_Vector_base(&(this->_M_buckets).
                   super__Vector_base<cmsys::_Hashtable_node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::allocator<cmsys::_Hashtable_node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>_>
                 );
  return;
}

Assistant:

~hashtable() { clear(); }